

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasGrayscaleFloat16Image(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  ImageFeatureType_ColorSpace IVar3;
  ModelDescription *pMVar4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar5;
  reference pFVar6;
  FeatureType *pFVar7;
  ImageFeatureType *pIVar8;
  FeatureDescription *output;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_1;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  Model *model_local;
  
  pMVar4 = Specification::Model::description(model);
  pRVar5 = Specification::ModelDescription::input(pMVar4);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar5);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar5)
  ;
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&input), bVar1) {
    pFVar6 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
    pFVar7 = Specification::FeatureDescription::type(pFVar6);
    TVar2 = Specification::FeatureType::Type_case(pFVar7);
    if (TVar2 == kImageType) {
      pFVar7 = Specification::FeatureDescription::type(pFVar6);
      pIVar8 = Specification::FeatureType::imagetype(pFVar7);
      IVar3 = Specification::ImageFeatureType::colorspace(pIVar8);
      if (IVar3 == ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) {
        return true;
      }
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  pMVar4 = Specification::Model::description(model);
  pRVar5 = Specification::ModelDescription::output(pMVar4);
  __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar5);
  output = (FeatureDescription *)
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                     (pRVar5);
  do {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                      (&__end1_1,(iterator *)&output);
    if (!bVar1) {
      return false;
    }
    pFVar6 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1_1);
    pFVar7 = Specification::FeatureDescription::type(pFVar6);
    TVar2 = Specification::FeatureType::Type_case(pFVar7);
    if (TVar2 == kMultiArrayType) {
      pFVar7 = Specification::FeatureDescription::type(pFVar6);
      pIVar8 = Specification::FeatureType::imagetype(pFVar7);
      IVar3 = Specification::ImageFeatureType::colorspace(pIVar8);
      if (IVar3 == ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) {
        return true;
      }
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool CoreML::hasGrayscaleFloat16Image(const Specification::Model& model) {
    for (const auto& input: model.description().input()) {
        if (input.type().Type_case() == Specification::FeatureType::kImageType) {
            if (input.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) {
                return true;
            }
        }
    }

    for (const auto& output: model.description().output()) {
        if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            if (output.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) {
                return true;
            }
        }
    }

    return false;
}